

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

StorageClass __thiscall
spirv_cross::CompilerGLSL::get_expression_effective_storage_class(CompilerGLSL *this,uint32_t ptr)

{
  Types TVar1;
  uint uVar2;
  uint32_t id;
  SPIRVariable *pSVar3;
  Variant *this_00;
  SPIRExpression *pSVar4;
  size_type sVar5;
  SPIRType *pSVar6;
  bool bVar7;
  bool forced_temporary;
  SPIRVariable *var;
  CompilerGLSL *pCStack_18;
  uint32_t ptr_local;
  CompilerGLSL *this_local;
  
  var._4_4_ = ptr;
  pCStack_18 = this;
  pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr);
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                       (ulong)var._4_4_);
  TVar1 = Variant::get_type(this_00);
  bVar7 = false;
  if (TVar1 == TypeExpression) {
    pSVar4 = Compiler::get<spirv_cross::SPIRExpression>(&this->super_Compiler,var._4_4_);
    bVar7 = false;
    if ((pSVar4->access_chain & 1U) == 0) {
      sVar5 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_Compiler).forced_temporaries,(key_type *)((long)&var + 4));
      bVar7 = true;
      if (sVar5 == 0) {
        sVar5 = ::std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::count(&(this->super_Compiler).forwarded_temporaries,(key_type *)((long)&var + 4));
        bVar7 = sVar5 == 0;
      }
    }
  }
  if ((pSVar3 == (SPIRVariable *)0x0) || (bVar7)) {
    pSVar6 = Compiler::expression_type(&this->super_Compiler,var._4_4_);
    this_local._4_4_ = pSVar6->storage;
  }
  else {
    uVar2 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar3,4);
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar3,0xc);
      if ((uVar2 & 1) == 0) {
        if (pSVar3->storage == StorageClassUniform) {
          id = TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(pSVar3->super_IVariant).field_0xc);
          pSVar6 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
          bVar7 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar6->super_IVariant).self.id,
                             DecorationBufferBlock);
          if (bVar7) {
            return StorageClassStorageBuffer;
          }
        }
        this_local._4_4_ = pSVar3->storage;
      }
      else {
        this_local._4_4_ = StorageClassStorageBuffer;
      }
    }
    else {
      this_local._4_4_ = StorageClassWorkgroup;
    }
  }
  return this_local._4_4_;
}

Assistant:

StorageClass CompilerGLSL::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
			return StorageClassWorkgroup;
		if (variable_decl_is_remapped_storage(*var, StorageClassStorageBuffer))
			return StorageClassStorageBuffer;

		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}